

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O3

void helics::detail::convertFromBinary(byte *data,NamedPoint *val)

{
  undefined1 uVar1;
  undefined4 uVar2;
  undefined1 *puVar3;
  long lVar4;
  
  val->value = *(double *)(data + 8);
  uVar2 = *(undefined4 *)(data + 4);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
            (&val->name,0,(val->name)._M_string_length,(char *)(data + 0x10),
             (ulong)((uint)uVar2 >> 0x18 | (uint)(uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                    uVar2 << 0x18));
  if ((*data & 1) != 0) {
    puVar3 = (undefined1 *)((long)&val->value + 7);
    lVar4 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&val->value + lVar4);
      *(undefined1 *)((long)&val->value + lVar4) = *puVar3;
      *puVar3 = uVar1;
      lVar4 = lVar4 + 1;
      puVar3 = puVar3 + -1;
    } while (lVar4 != 4);
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, NamedPoint& val)
{
    std::memcpy(&val.value, data + 8, 8);
    const std::size_t size = getDataSize(data);
    val.name.assign(reinterpret_cast<const char*>(data) + 16U,
                    reinterpret_cast<const char*>(data) + 16U + size);
    if ((data[0] & endianMask) != littleEndianCode) {
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val.value));
    }
}